

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.cpp
# Opt level: O1

void crnlib::RangeEnc_EncodeBit(CRangeEnc *p,UInt16 *prob,UInt32 symbol)

{
  ushort uVar1;
  short sVar2;
  uint uVar3;
  
  uVar1 = *prob;
  uVar3 = (p->range >> 0xb) * (uint)uVar1;
  if (symbol == 0) {
    p->range = uVar3;
    sVar2 = (short)(0x800 - uVar1 >> 5);
  }
  else {
    p->low = p->low + (ulong)uVar3;
    p->range = p->range - uVar3;
    sVar2 = -(uVar1 >> 5);
  }
  *prob = uVar1 + sVar2;
  if (p->range < 0x1000000) {
    p->range = p->range << 8;
    RangeEnc_ShiftLow(p);
    return;
  }
  return;
}

Assistant:

static void RangeEnc_EncodeBit(CRangeEnc* p, CLzmaProb* prob, UInt32 symbol) {
  UInt32 ttt = *prob;
  UInt32 newBound = (p->range >> kNumBitModelTotalBits) * ttt;
  if (symbol == 0) {
    p->range = newBound;
    ttt += (kBitModelTotal - ttt) >> kNumMoveBits;
  } else {
    p->low += newBound;
    p->range -= newBound;
    ttt -= ttt >> kNumMoveBits;
  }
  *prob = (CLzmaProb)ttt;
  if (p->range < kTopValue) {
    p->range <<= 8;
    RangeEnc_ShiftLow(p);
  }
}